

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

lysc_pattern ** lysc_patterns_dup(ly_ctx *ctx,lysc_pattern **orig)

{
  long *plVar1;
  lysc_pattern *plVar2;
  lysc_pattern *local_78;
  lysc_pattern *local_68;
  lysc_pattern *local_58;
  char *p__;
  uint64_t u;
  lysc_pattern **dup;
  lysc_pattern **orig_local;
  ly_ctx *ctx_local;
  
  if (orig == (lysc_pattern **)0x0) {
    __assert_fail("orig",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x14f,
                  "struct lysc_pattern **lysc_patterns_dup(struct ly_ctx *, struct lysc_pattern **)"
                 );
  }
  if (orig == (lysc_pattern **)0x0) {
    local_58 = (lysc_pattern *)0x0;
  }
  else {
    local_58 = orig[-1];
  }
  plVar1 = (long *)calloc(1,(long)local_58 * 8 + 8);
  if (plVar1 == (long *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_patterns_dup");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    ctx_local = (ly_ctx *)(plVar1 + 1);
    if (ctx_local != (ly_ctx *)0x0) {
      if (orig == (lysc_pattern **)0x0) {
        local_68 = (lysc_pattern *)0x0;
      }
      else {
        local_68 = orig[-1];
      }
      memset(&(ctx_local->dict).hash_tab + *plVar1,0,(long)local_68 << 3);
    }
    p__ = (char *)0x0;
    while( true ) {
      if (orig == (lysc_pattern **)0x0) {
        local_78 = (lysc_pattern *)0x0;
      }
      else {
        local_78 = orig[-1];
      }
      if (local_78 <= p__) break;
      plVar2 = lysc_pattern_dup(orig[(long)p__]);
      (&(ctx_local->dict).hash_tab)[(long)p__] = (ly_ht *)plVar2;
      *plVar1 = *plVar1 + 1;
      p__ = p__ + 1;
    }
  }
  return (lysc_pattern **)ctx_local;
}

Assistant:

static struct lysc_pattern **
lysc_patterns_dup(struct ly_ctx *ctx, struct lysc_pattern **orig)
{
    struct lysc_pattern **dup = NULL;
    LY_ARRAY_COUNT_TYPE u;

    assert(orig);

    LY_ARRAY_CREATE_RET(ctx, dup, LY_ARRAY_COUNT(orig), NULL);
    LY_ARRAY_FOR(orig, u) {
        dup[u] = lysc_pattern_dup(orig[u]);
        LY_ARRAY_INCREMENT(dup);
    }
    return dup;
}